

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O2

void __thiscall
streams_tests::streams_serializedata_xor::test_method(streams_serializedata_xor *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  const_string file;
  Span<const_std::byte> sp;
  initializer_list<unsigned_char> __l_00;
  const_string file_00;
  Span<const_std::byte> sp_00;
  initializer_list<unsigned_char> __l_01;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  DataStream ds;
  vector<std::byte,_std::allocator<std::byte>_> in;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DataStream::DataStream(&ds,(Span<const_std::byte>)ZEXT816(0));
  local_58._M_dataplus._M_p._0_2_ = 0;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,__l,
             (allocator_type *)&local_78);
  DataStream::Xor(&ds,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f8);
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xe5;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  local_f8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_100 = "";
  s_abi_cxx11_(&local_58,"",0);
  DataStream::str_abi_cxx11_(&local_78,&ds);
  pvVar1 = (iterator)0x2;
  pbVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_108,0xe5,1,2,pbVar2,"\"\"s",&local_78,"ds.str()");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ds);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xf;
  std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>(&in,(byte *)&ds);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xf0;
  std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>(&in,(byte *)&ds);
  sp.m_size = (long)in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
  sp.m_data = in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start;
  DataStream::DataStream(&ds,sp);
  local_58._M_dataplus._M_p._0_2_ = CONCAT11(local_58._M_dataplus._M_p._1_1_,0xff);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,__l_00,
             (allocator_type *)&local_78);
  DataStream::Xor(&ds,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f8);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xef;
  file_00.m_begin = (iterator)&local_118;
  msg_00.m_end = (iterator)pbVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
             msg_00);
  local_f8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_130 = "";
  s_abi_cxx11_(&local_58,anon_var_dwarf_10d72f5,2);
  DataStream::str_abi_cxx11_(&local_78,&ds);
  pvVar1 = (iterator)0x2;
  pbVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_138,0xef,1,2,pbVar2,"\"\\xf0\\x0f\"s",&local_78,"ds.str()");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ds);
  if (in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
    _M_finish = in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xf0;
  std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>(&in,(byte *)&ds);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xf;
  std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>(&in,(byte *)&ds);
  sp_00.m_size = (long)in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start;
  sp_00.m_data = in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
  DataStream::DataStream(&ds,sp_00);
  local_58._M_dataplus._M_p._0_2_ = 0xfff;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,__l_01,
             (allocator_type *)&local_78);
  DataStream::Xor(&ds,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f8);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xfb;
  file_01.m_begin = (iterator)&local_148;
  msg_01.m_end = (iterator)pbVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_158,
             msg_01);
  local_f8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_160 = "";
  s_abi_cxx11_(&local_58,"\x0f",2);
  DataStream::str_abi_cxx11_(&local_78,&ds);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_f8,&local_168,0xfb,1,2,&local_58,"\"\\x0f\\x00\"s",&local_78,"ds.str()");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ds);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&in.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_serializedata_xor)
{
    std::vector<std::byte> in;

    // Degenerate case
    {
        DataStream ds{in};
        ds.Xor({0x00, 0x00});
        BOOST_CHECK_EQUAL(""s, ds.str());
    }

    in.push_back(std::byte{0x0f});
    in.push_back(std::byte{0xf0});

    // Single character key
    {
        DataStream ds{in};
        ds.Xor({0xff});
        BOOST_CHECK_EQUAL("\xf0\x0f"s, ds.str());
    }

    // Multi character key

    in.clear();
    in.push_back(std::byte{0xf0});
    in.push_back(std::byte{0x0f});

    {
        DataStream ds{in};
        ds.Xor({0xff, 0x0f});
        BOOST_CHECK_EQUAL("\x0f\x00"s, ds.str());
    }
}